

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O3

Expression * __thiscall duckdb::FilterCombiner::GetNode(FilterCombiner *this,Expression *expr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  key_type kVar2;
  iterator iVar3;
  type pEVar4;
  mapped_type *pmVar5;
  pointer *__ptr;
  key_type local_28;
  key_type local_20;
  
  local_28._M_data = expr;
  iVar3 = ::std::
          _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->stored_expressions)._M_h,&local_28);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*(expr->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_28,expr);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_28);
    local_20._M_data = pEVar4;
    pmVar5 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->stored_expressions,&local_20);
    kVar2._M_data = local_28._M_data;
    local_28._M_data = (Expression *)0x0;
    _Var1._M_head_impl =
         (pmVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pmVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = kVar2._M_data;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_28._M_data != (Expression *)0x0) {
      (*((local_28._M_data)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  else {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)((long)iVar3.
                                 super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_true>
                                 ._M_cur + 0x10));
  }
  return pEVar4;
}

Assistant:

Expression &FilterCombiner::GetNode(Expression &expr) {
	auto entry = stored_expressions.find(expr);
	if (entry != stored_expressions.end()) {
		// expression already exists: return a reference to the stored expression
		return *entry->second;
	}
	// expression does not exist yet: create a copy and store it
	auto copy = expr.Copy();
	auto &copy_ref = *copy;
	D_ASSERT(stored_expressions.find(copy_ref) == stored_expressions.end());
	stored_expressions[copy_ref] = std::move(copy);
	return copy_ref;
}